

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

bool __thiscall
args::ValueReader<int>::operator()
          (ValueReader<int> *this,string *name,string *value,int *destination)

{
  long lVar1;
  ostream *poVar2;
  ParseError *this_00;
  int *in_RCX;
  string *in_RDX;
  string *in_RSI;
  ostringstream problem;
  istringstream ss;
  string *in_stack_fffffffffffffc68;
  ostringstream local_328 [392];
  istringstream local_1a0 [384];
  int *local_20;
  string *local_18;
  string *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::istringstream::istringstream(local_1a0,in_RDX,_S_in);
  std::istream::operator>>(local_1a0,local_20);
  std::__cxx11::istringstream::rdbuf();
  lVar1 = std::streambuf::in_avail();
  if (0 < lVar1) {
    std::__cxx11::ostringstream::ostringstream(local_328);
    poVar2 = std::operator<<((ostream *)local_328,"Argument \'");
    poVar2 = std::operator<<(poVar2,local_10);
    poVar2 = std::operator<<(poVar2,"\' received invalid value type \'");
    poVar2 = std::operator<<(poVar2,local_18);
    std::operator<<(poVar2,"\'");
    this_00 = (ParseError *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    ParseError::ParseError(this_00,in_stack_fffffffffffffc68);
    __cxa_throw(this_00,&ParseError::typeinfo,ParseError::~ParseError);
  }
  std::__cxx11::istringstream::~istringstream(local_1a0);
  return true;
}

Assistant:

bool operator ()(const std::string &name, const std::string &value, T &destination)
        {
            std::istringstream ss(value);
            ss >> destination;

            if (ss.rdbuf()->in_avail() > 0)
            {
#ifdef ARGS_NOEXCEPT
                return false;
#else
                std::ostringstream problem;
                problem << "Argument '" << name << "' received invalid value type '" << value << "'";
                throw ParseError(problem.str());
#endif
            }
            return true;
        }